

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AssertionInstanceExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
          (BumpAllocator *this,Type *args,Symbol *args_1,AssertionExpr *args_2,bool *args_3,
          SourceRange *args_4)

{
  AssertionInstanceExpression *pAVar1;
  Symbol *in_RCX;
  Type *in_RDX;
  AssertionInstanceExpression *in_RSI;
  AssertionExpr *in_R8;
  undefined8 in_R9;
  undefined1 isRecursiveProperty;
  SourceRange in_stack_00000000;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  isRecursiveProperty = (undefined1)((ulong)in_R9 >> 0x38);
  pAVar1 = (AssertionInstanceExpression *)
           allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ast::AssertionInstanceExpression::AssertionInstanceExpression
            (in_RSI,in_RDX,in_RCX,in_R8,(bool)isRecursiveProperty,in_stack_00000000);
  return pAVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }